

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirSETBREAKPOINT(void)

{
  uint in_EAX;
  int iVar1;
  ulong uStack_8;
  aint val;
  
  if (pass != 3) {
    SkipToEol(&lp);
    return;
  }
  uStack_8 = (ulong)in_EAX;
  iVar1 = SkipBlanks(&lp);
  if (iVar1 != 0) {
    WriteBreakpoint(CurAddress);
    return;
  }
  iVar1 = ParseExpressionNoSyntaxError(&lp,&val);
  if (iVar1 == 0) {
    Error("[SETBREAKPOINT] Syntax error",bp,SUPPRESS);
  }
  else {
    WriteBreakpoint(val);
  }
  return;
}

Assistant:

static void dirSETBREAKPOINT() {
	if (LASTPASS != pass) {
		SkipToEol(lp);
		return;
	}
	aint val = 0;
	if (SkipBlanks(lp)) {		// without any expression do the "$" breakpoint
		WriteBreakpoint(CurAddress);
	} else if (ParseExpressionNoSyntaxError(lp, val)) {
		WriteBreakpoint(val);
	} else {
		Error("[SETBREAKPOINT] Syntax error", bp, SUPPRESS);
	}
}